

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_ngon.cpp
# Opt level: O2

uint __thiscall
ON_MeshNgon::GetBoundarySides
          (ON_MeshNgon *this,ON_MeshFaceList *mesh_face_list,
          ON_SimpleArray<unsigned_int> *ngon_boundary_sides)

{
  uint face_index_count;
  uint *face_index_list;
  bool bVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint ngon_boundary_index;
  ON_SimpleArray<NgonNeighbors> ngon_nbr_map;
  
  iVar4 = ngon_boundary_sides->m_capacity;
  if (-1 < iVar4) {
    ngon_boundary_sides->m_count = 0;
  }
  face_index_count = this->m_Fcount;
  face_index_list = this->m_fi;
  if (face_index_list != (uint *)0x0 && (ulong)face_index_count != 0) {
    ngon_nbr_map._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00826fa0;
    ngon_nbr_map.m_a = (NgonNeighbors *)0x0;
    ngon_nbr_map.m_count = 0;
    ngon_nbr_map.m_capacity = 0;
    ON_SimpleArray<NgonNeighbors>::Reserve(&ngon_nbr_map,(ulong)face_index_count);
    if ((-1 < (int)face_index_count) && ((int)face_index_count <= ngon_nbr_map.m_capacity)) {
      ngon_nbr_map.m_count = face_index_count;
    }
    uVar2 = SetFaceNeighborMap(0xfffffffe,mesh_face_list,(uint **)0x0,(ON_MeshVertexFaceMap *)0x0,
                               face_index_count,face_index_list,ngon_nbr_map.m_a);
    bVar1 = true;
    if (uVar2 != 0) {
      if (-1 < ngon_boundary_sides->m_capacity) {
        ngon_boundary_sides->m_count = 0;
      }
      ON_SimpleArray<unsigned_int>::Reserve(ngon_boundary_sides,(ulong)uVar2);
      ngon_boundary_index = 0;
      do {
        uVar3 = GetNgonBoundarySegments
                          (mesh_face_list,face_index_count,face_index_list,ngon_boundary_index,
                           ngon_nbr_map.m_a,(ON_SimpleArray<unsigned_int> *)0x0,ngon_boundary_sides)
        ;
        if (uVar3 == 0) {
          bVar1 = true;
          goto LAB_0053b42e;
        }
        ngon_boundary_index = ngon_boundary_index + uVar3;
      } while (ngon_boundary_index < uVar2);
      uVar2 = ngon_boundary_sides->m_count;
      bVar1 = false;
    }
LAB_0053b42e:
    ON_SimpleArray<NgonNeighbors>::~ON_SimpleArray(&ngon_nbr_map);
    if (!bVar1) {
      return uVar2;
    }
    iVar4 = ngon_boundary_sides->m_capacity;
  }
  if (-1 < iVar4) {
    ngon_boundary_sides->m_count = 0;
  }
  return 0;
}

Assistant:

unsigned int ON_MeshNgon::GetBoundarySides(
  const class ON_MeshFaceList& mesh_face_list,
  ON_SimpleArray<unsigned int>& ngon_boundary_sides
  ) const
{
  unsigned int ngon_boundary_segment_count = 0;
  unsigned int boundary_edge_count;

  ngon_boundary_sides.SetCount(0);


  for(;;)
  {
    const unsigned int ngon_fi_count(m_Fcount);
    const unsigned int* ngon_fi(m_fi);
    if ( ngon_fi_count <= 0 || 0 == ngon_fi )
      break;

    const unsigned int mesh_vertex_count = 0xFFFFFFFE;
    const unsigned int *const* vertex_face_map = 0;

    ON_SimpleArray<struct NgonNeighbors> ngon_nbr_map;
    ngon_nbr_map.Reserve(ngon_fi_count);
    ngon_nbr_map.SetCount(ngon_fi_count);
    boundary_edge_count = SetFaceNeighborMap(
      mesh_vertex_count,
      mesh_face_list,
      vertex_face_map,
      nullptr,
      ngon_fi_count,
      ngon_fi,
      ngon_nbr_map.Array()
      );

    if ( boundary_edge_count <= 0 )
      break;

    ngon_boundary_sides.SetCount(0);
    ngon_boundary_sides.Reserve(boundary_edge_count);

    for(;;)
    {
      // keep adding boundary components until we
      // find all of them or there is an error
      unsigned int segment_count =  GetNgonBoundarySegments(
        mesh_face_list,
        (unsigned int)ngon_fi_count,
        ngon_fi,
        ngon_boundary_segment_count,
        ngon_nbr_map.Array(),
        0,
        &ngon_boundary_sides
        );
      if ( segment_count <= 0 )
        break; //error

      ngon_boundary_segment_count += segment_count;
      if ( ngon_boundary_segment_count >= boundary_edge_count )
        return ngon_boundary_sides.UnsignedCount(); // found them all
    }

    break; // error if we get here
  }

  // failure
  ngon_boundary_sides.SetCount(0);

  return 0;
}